

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O2

int __thiscall
qclab::qgates::RotationX<std::complex<double>_>::toQASM
          (RotationX<std::complex<double>_> *this,ostream *stream,int offset)

{
  int iVar1;
  double angle;
  __string_type _Stack_38;
  
  iVar1 = (this->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
          qubit_;
  angle = QRotation<double>::theta(&(this->super_QRotationGate1<std::complex<double>_>).rotation_);
  qasmRx<double>(&_Stack_38,offset + iVar1,angle);
  std::operator<<(stream,(string *)&_Stack_38);
  std::__cxx11::string::~string((string *)&_Stack_38);
  return 0;
}

Assistant:

int toQASM( std::ostream& stream ,
                    const int offset = 0 ) const override {
          stream << qasmRx( this->qubit_ + offset , this->theta() ) ;
          return 0 ;
        }